

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O2

bool __thiscall
ON_AerialPhotoCameraPosition::SetOrientationAnglesRadians
          (ON_AerialPhotoCameraPosition *this,double omega_radians,double phi_radians,
          double kappa_radians)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double xx;
  double d;
  double d_00;
  ON_3dVector axis;
  ON_3dVector axis_00;
  ON_3dVector axis_01;
  ON_3dPoint center;
  ON_3dPoint center_00;
  ON_3dPoint center_01;
  bool bVar4;
  double *pdVar5;
  long lVar6;
  int i;
  int i_00;
  ON_Xform *pOVar7;
  ON_Xform *pOVar8;
  int j;
  byte bVar9;
  double local_538;
  ON_3dVector z3;
  ON_3dVector local_4d0;
  ON_3dVector y3;
  ON_3dVector x3;
  ON_3dVector z0;
  ON_3dVector y0;
  ON_3dVector x0;
  ON_3dVector Z;
  ON_3dVector Y;
  ON_3dVector X;
  ON_Xform r1;
  ON_Xform r2;
  ON_3dVector y2;
  ON_3dVector x1;
  ON_3dVector r2r1z0;
  ON_3dVector r1y0;
  ON_3dVector x2;
  ON_3dVector z2;
  ON_3dVector z1;
  ON_3dVector y1;
  ON_Xform zero;
  ON_Xform r3;
  ON_Xform local_130;
  ON_Xform r321;
  
  bVar9 = 0;
  bVar4 = ON_IsValid(omega_radians);
  if (((bVar4) && (bVar4 = ON_IsValid(phi_radians), bVar4)) &&
     (bVar4 = ON_IsValid(kappa_radians), bVar4)) {
    ON_3dVector::Set(&this->m_orientation_angles_radians,omega_radians,phi_radians,kappa_radians);
    ON_3dVector::Set(&this->m_orientation_angles_degrees,(omega_radians * 180.0) / 3.141592653589793
                     ,(phi_radians * 180.0) / 3.141592653589793,
                     (kappa_radians * 180.0) / 3.141592653589793);
    dVar1 = cos(omega_radians);
    dVar2 = sin(omega_radians);
    dVar3 = cos(phi_radians);
    xx = sin(phi_radians);
    d = cos(kappa_radians);
    d_00 = sin(kappa_radians);
    ON_3dVector::ON_3dVector
              (&X,dVar3 * d,d_00 * dVar1 + dVar2 * xx * d,d_00 * dVar2 - xx * d * dVar1);
    ON_3dVector::ON_3dVector
              (&Y,-d_00 * dVar3,d * dVar1 - dVar2 * xx * d_00,d * dVar2 + xx * d_00 * dVar1);
    ON_3dVector::ON_3dVector(&Z,xx,-dVar3 * dVar2,dVar1 * dVar3);
    ON_Xform::ON_Xform(&local_130);
    local_130.m_xform[0][0] = X.x;
    local_130.m_xform[0][1] = Y.x;
    local_130.m_xform[0][2] = Z.x;
    local_130.m_xform[0][3] = 0.0;
    local_130.m_xform[1][0] = X.y;
    local_130.m_xform[1][1] = Y.y;
    local_130.m_xform[1][2] = Z.y;
    local_130.m_xform[1][3] = 0.0;
    local_130.m_xform[2][0] = X.z;
    local_130.m_xform[2][1] = Y.z;
    local_130.m_xform[2][2] = Z.z;
    local_130.m_xform[3][1] = 0.0;
    local_130.m_xform[3][2] = 0.0;
    local_130.m_xform[2][3] = 0.0;
    local_130.m_xform[3][0] = 0.0;
    local_130.m_xform[3][3] = 1.0;
    pOVar7 = &local_130;
    pOVar8 = &this->m_orientation_rotation;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      pOVar8->m_xform[0][0] = pOVar7->m_xform[0][0];
      pOVar7 = (ON_Xform *)((long)pOVar7 + ((ulong)bVar9 * -2 + 1) * 8);
      pOVar8 = (ON_Xform *)((long)pOVar8 + (ulong)bVar9 * -0x10 + 8);
    }
    (this->m_orientation_right).z = X.z;
    (this->m_orientation_right).x = X.x;
    (this->m_orientation_right).y = X.y;
    (this->m_orientation_up).x = Y.x;
    (this->m_orientation_up).y = Y.y;
    (this->m_orientation_up).z = Y.z;
    ON_3dVector::operator-((ON_3dVector *)&r1,&Z);
    (this->m_orientation_direction).z = r1.m_xform[0][2];
    (this->m_orientation_direction).x = r1.m_xform[0][0];
    (this->m_orientation_direction).y = r1.m_xform[0][1];
    this->m_status = this->m_status | 2;
    local_538 = 0.0;
    ON_3dVector::ON_3dVector(&x0,1.0,0.0,0.0);
    ON_3dVector::ON_3dVector(&y0,0.0,1.0,0.0);
    ON_3dVector::ON_3dVector(&z0,0.0,0.0,1.0);
    x1.z = x0.z;
    x1.x = x0.x;
    x1.y = x0.y;
    ::operator*((ON_3dVector *)&r1,dVar1,&y0);
    ::operator*((ON_3dVector *)&r2,dVar2,&z0);
    ON_3dVector::operator+(&y1,(ON_3dVector *)&r1,(ON_3dVector *)&r2);
    ::operator*((ON_3dVector *)&r1,-dVar2,&y0);
    ::operator*((ON_3dVector *)&r2,dVar1,&z0);
    ON_3dVector::operator+(&z1,(ON_3dVector *)&r1,(ON_3dVector *)&r2);
    y2.z = y1.z;
    y2.x = y1.x;
    y2.y = y1.y;
    ::operator*((ON_3dVector *)&r1,xx,&x1);
    ::operator*((ON_3dVector *)&r2,dVar3,&z1);
    ON_3dVector::operator+(&z2,(ON_3dVector *)&r1,(ON_3dVector *)&r2);
    ::operator*((ON_3dVector *)&r1,dVar3,&x1);
    ::operator*((ON_3dVector *)&r2,xx,&z1);
    ON_3dVector::operator-(&x2,(ON_3dVector *)&r1,(ON_3dVector *)&r2);
    z3.z = z2.z;
    z3.x = z2.x;
    z3.y = z2.y;
    ::operator*((ON_3dVector *)&r1,d,&x2);
    ::operator*((ON_3dVector *)&r2,d_00,&y2);
    ON_3dVector::operator+(&x3,(ON_3dVector *)&r1,(ON_3dVector *)&r2);
    ::operator*((ON_3dVector *)&r1,-d_00,&x2);
    ::operator*((ON_3dVector *)&r2,d,&y2);
    ON_3dVector::operator+(&y3,(ON_3dVector *)&r1,(ON_3dVector *)&r2);
    ON_Xform::ON_Xform(&r1);
    axis.y = x0.y;
    axis.x = x0.x;
    axis.z = x0.z;
    center.y = ON_3dPoint::Origin.y;
    center.x = ON_3dPoint::Origin.x;
    center.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation(&r1,omega_radians,axis,center);
    ON_Xform::operator*(&r1y0,&r1,&y0);
    ON_Xform::ON_Xform(&r2);
    axis_00.y = r1y0.y;
    axis_00.x = r1y0.x;
    axis_00.z = r1y0.z;
    center_00.y = ON_3dPoint::Origin.y;
    center_00.x = ON_3dPoint::Origin.x;
    center_00.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation(&r2,phi_radians,axis_00,center_00);
    ON_Xform::operator*(&r3,&r2,&r1);
    ON_Xform::operator*(&r2r1z0,&r3,&z0);
    ON_Xform::ON_Xform(&r3);
    axis_01.y = r2r1z0.y;
    axis_01.x = r2r1z0.x;
    axis_01.z = r2r1z0.z;
    center_01.y = ON_3dPoint::Origin.y;
    center_01.x = ON_3dPoint::Origin.x;
    center_01.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation(&r3,kappa_radians,axis_01,center_01);
    ON_Xform::operator*(&zero,&r3,&r2);
    ON_Xform::operator*(&r321,&zero,&r1);
    ON_Xform::operator-(&zero,&r321,&local_130);
    for (i_00 = 0; i_00 != 4; i_00 = i_00 + 1) {
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        pdVar5 = ON_Xform::operator[](&zero,i_00);
        dVar1 = ABS(pdVar5[lVar6]);
        if (ABS(pdVar5[lVar6]) <= local_538) {
          dVar1 = local_538;
        }
        local_538 = dVar1;
      }
    }
    ON_3dVector::operator-(&local_4d0,&x3,&X);
    dVar1 = ON_3dVector::MaximumCoordinate(&local_4d0);
    dVar2 = ABS(dVar1);
    if (ABS(dVar1) <= local_538) {
      dVar2 = local_538;
    }
    ON_3dVector::operator-(&local_4d0,&y3,&Y);
    dVar1 = ON_3dVector::MaximumCoordinate(&local_4d0);
    dVar3 = ABS(dVar1);
    if (ABS(dVar1) <= dVar2) {
      dVar3 = dVar2;
    }
    ON_3dVector::operator-(&local_4d0,&z3,&Z);
    dVar1 = ON_3dVector::MaximumCoordinate(&local_4d0);
    dVar2 = ABS(dVar1);
    if (ABS(dVar1) <= dVar3) {
      dVar2 = dVar3;
    }
    if (1e-15 < dVar2) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_photogrammetry.cpp"
                 ,0x2d9,"","Transform trauma");
    }
    return true;
  }
  UnsetOrientation(this);
  return false;
}

Assistant:

bool ON_AerialPhotoCameraPosition::SetOrientationAnglesRadians(
    double omega_radians, 
    double phi_radians, 
    double kappa_radians
    )
{
  bool rc = false;

  if ( ON_IsValid(omega_radians) && ON_IsValid(phi_radians) && ON_IsValid(kappa_radians) )
  {
    m_orientation_angles_radians.Set(omega_radians,phi_radians,kappa_radians);
    m_orientation_angles_degrees.Set(omega_radians*180.0/ON_PI,phi_radians*180.0/ON_PI,kappa_radians*180.0/ON_PI);

    const double c1 = cos(omega_radians);
    const double s1 = sin(omega_radians);
  
    const double c2 = cos(phi_radians);
    const double s2 = sin(phi_radians);
  
    const double c3 = cos(kappa_radians);
    const double s3 = sin(kappa_radians);

    const ON_3dVector X( c3*c2,  s3*c1 + c3*s2*s1,  s3*s1 - c3*s2*c1);
    const ON_3dVector Y(-s3*c2,  c3*c1 - s3*s2*s1,  c3*s1 + s3*s2*c1);
    const ON_3dVector Z(    s2,            -c2*s1,             c2*c1);

    ON_Xform R;
    R.m_xform[0][0] = X.x; R.m_xform[0][1] = Y.x; R.m_xform[0][2] = Z.x; R.m_xform[0][3] = 0.0;
    R.m_xform[1][0] = X.y; R.m_xform[1][1] = Y.y; R.m_xform[1][2] = Z.y; R.m_xform[1][3] = 0.0;
    R.m_xform[2][0] = X.z; R.m_xform[2][1] = Y.z; R.m_xform[2][2] = Z.z; R.m_xform[2][3] = 0.0;
    R.m_xform[3][0] = 0.0; R.m_xform[3][1] = 0.0; R.m_xform[3][2] = 0.0; R.m_xform[3][3] = 1.0;

    m_orientation_rotation = R;

    m_orientation_right = X;
    m_orientation_up = Y;
    m_orientation_direction = -Z;

    m_status |= 2;

    rc = true;

    {
      // Debugging validation tests

      const ON_3dVector x0(1.0,0.0,0.0);
      const ON_3dVector y0(0.0,1.0,0.0);
      const ON_3dVector z0(0.0,0.0,1.0);

      const ON_3dVector x1 = x0;
      const ON_3dVector y1 =  c1*y0 + s1*z0;
      const ON_3dVector z1 = -s1*y0 + c1*z0;

      const ON_3dVector y2 = y1;
      const ON_3dVector z2 = s2*x1 + c2*z1;
      const ON_3dVector x2 = c2*x1 - s2*z1;

      const ON_3dVector z3 =  z2;
      const ON_3dVector x3 =  c3*x2 + s3*y2;
      const ON_3dVector y3 = -s3*x2 + c3*y2;

      /*
      const ON_3dVector x1 = x0;
      const ON_3dVector y1 = (0.0,  c1,  s1);
      const ON_3dVector z1 = (0.0, -s1,  c1);

      const ON_3dVector x2 = (c2,  s2*s1, -s2*c1); // c2*x1 - s2*z1;
      const ON_3dVector y2 = (0.0,    c1,     s1);
      const ON_3dVector z2 = (s2, -c2*s1,  c2*c1); // s2*x1 + c2*z1
      */


      ON_Xform r1;
      r1.Rotation(omega_radians,x0,ON_3dPoint::Origin);
      ON_3dVector r1y0 = r1*y0;

      ON_Xform r2;
      r2.Rotation(phi_radians,r1y0,ON_3dPoint::Origin);
      ON_3dVector r2r1z0 = r2*r1*z0;

      ON_Xform r3;
      r3.Rotation(kappa_radians,r2r1z0,ON_3dPoint::Origin);

      ON_Xform r321 = r3*r2*r1;


      ON_Xform zero = r321 - R;

      double a, b;
      double max_zero = 0.0;
      for ( int i = 0; i < 4; i++ ) for ( int j = 0; j < 4; j++ )
      {
        a = fabs(zero[i][j]);
        if (a > max_zero )
          max_zero = a;
      }
      b = fabs((x3-X).MaximumCoordinate());
      if ( b > max_zero )
        max_zero = b;
      b = fabs((y3-Y).MaximumCoordinate());
      if ( b > max_zero )
        max_zero = b;
      b = fabs((z3-Z).MaximumCoordinate());
      if ( b > max_zero )
        max_zero = b;


      if ( max_zero > 1.0e-15 )
        ON_ERROR("Transform trauma");
    }
  }
  else
  {
    UnsetOrientation();
  }

  return rc;
}